

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O1

void Bozo_sort(int *arr,int len,Order type)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  char local_3a [2];
  int local_38;
  Order local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BOZO ARR",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_34 = type;
  if (type == DESC) {
    bVar1 = is_sort(arr,len,DESC);
    if (!bVar1) {
      local_38 = len + -1;
      do {
        iVar2 = rand();
        iVar2 = iVar2 % len;
        iVar3 = rand();
        iVar4 = (uint)(iVar2 <= iVar3 % local_38) + iVar3 % local_38;
        iVar3 = arr[iVar2];
        arr[iVar2] = arr[iVar4];
        arr[iVar4] = iVar3;
        if (0 < len) {
          uVar6 = 0;
          do {
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[uVar6]);
            local_3a[0] = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a,1);
            uVar6 = uVar6 + 1;
          } while ((uint)len != uVar6);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        bVar1 = is_sort(arr,len,local_34);
      } while (!bVar1);
    }
  }
  else if ((type == ABC) && (bVar1 = is_sort(arr,len,ABC), !bVar1)) {
    local_38 = len + -1;
    do {
      iVar2 = rand();
      iVar2 = iVar2 % len;
      iVar3 = rand();
      iVar4 = (uint)(iVar3 % local_38 <= iVar2) + iVar3 % local_38;
      iVar3 = arr[iVar2];
      arr[iVar2] = arr[iVar4];
      arr[iVar4] = iVar3;
      if (0 < len) {
        uVar6 = 0;
        do {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[uVar6]);
          local_3a[1] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a + 1,1);
          uVar6 = uVar6 + 1;
        } while ((uint)len != uVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      bVar1 = is_sort(arr,len,local_34);
    } while (!bVar1);
  }
  return;
}

Assistant:

void Bozo_sort(int* arr, int len, Order type = ABC){
    cout << "BOZO ARR" << endl;
    switch (type) {
        case DESC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 >= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
        case ABC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 <= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
    }
}